

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  int iVar31;
  NodeRef *pNVar32;
  ulong uVar33;
  undefined8 uVar34;
  undefined4 uVar36;
  RTCRayN *pRVar35;
  ulong uVar37;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar38;
  ulong uVar39;
  NodeRef *pNVar40;
  long lVar41;
  bool bVar42;
  float fVar43;
  uint uVar44;
  float fVar48;
  float fVar50;
  vint4 bi;
  uint uVar49;
  uint uVar51;
  float fVar52;
  uint uVar53;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar54;
  uint uVar55;
  uint uVar56;
  float fVar59;
  float fVar62;
  vint4 ai;
  uint uVar60;
  uint uVar61;
  uint uVar63;
  uint uVar64;
  float fVar65;
  float fVar66;
  uint uVar67;
  uint uVar68;
  float fVar69;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar70;
  float fVar71;
  uint uVar72;
  float fVar73;
  uint uVar74;
  float fVar75;
  vint4 ai_1;
  uint uVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  uint uVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  ulong local_a98;
  undefined1 local_9b8 [16];
  ulong local_9a8;
  ulong local_9a0;
  ulong local_998;
  ulong local_990;
  NodeRef *local_988;
  ulong local_980;
  ulong local_978;
  undefined1 (*local_970) [16];
  NodeRef *local_968;
  ulong local_960;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_990 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_998 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_9a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_9a8 = local_990 ^ 0x10;
  local_978 = local_998 ^ 0x10;
  uVar38 = local_9a0 ^ 0x10;
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  local_970 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar40 = stack + 1;
  do {
    local_968 = pNVar40;
    if (local_968 == stack) break;
    local_988 = local_968 + -1;
    pNVar40 = (NodeRef *)local_968[-1].ptr;
    pNVar32 = local_968;
    do {
      uVar84 = 6;
      if (((ulong)pNVar40 & 8) == 0) {
        pfVar4 = (float *)((long)&pNVar40[4].ptr + local_990);
        fVar43 = (*pfVar4 - fVar5) * fVar8;
        fVar48 = (pfVar4[1] - fVar5) * fVar8;
        fVar50 = (pfVar4[2] - fVar5) * fVar8;
        fVar52 = (pfVar4[3] - fVar5) * fVar8;
        pfVar4 = (float *)((long)&pNVar40[4].ptr + local_998);
        fVar54 = (*pfVar4 - fVar6) * fVar9;
        fVar59 = (pfVar4[1] - fVar6) * fVar9;
        fVar62 = (pfVar4[2] - fVar6) * fVar9;
        fVar66 = (pfVar4[3] - fVar6) * fVar9;
        uVar55 = (uint)((int)fVar54 < (int)fVar43) * (int)fVar43 |
                 (uint)((int)fVar54 >= (int)fVar43) * (int)fVar54;
        uVar60 = (uint)((int)fVar59 < (int)fVar48) * (int)fVar48 |
                 (uint)((int)fVar59 >= (int)fVar48) * (int)fVar59;
        uVar63 = (uint)((int)fVar62 < (int)fVar50) * (int)fVar50 |
                 (uint)((int)fVar62 >= (int)fVar50) * (int)fVar62;
        uVar67 = (uint)((int)fVar66 < (int)fVar52) * (int)fVar52 |
                 (uint)((int)fVar66 >= (int)fVar52) * (int)fVar66;
        pfVar4 = (float *)((long)&pNVar40[4].ptr + local_9a0);
        fVar43 = (*pfVar4 - fVar7) * fVar10;
        fVar48 = (pfVar4[1] - fVar7) * fVar10;
        fVar50 = (pfVar4[2] - fVar7) * fVar10;
        fVar52 = (pfVar4[3] - fVar7) * fVar10;
        uVar44 = (uint)((int)fVar43 < iVar11) * iVar11 | (uint)((int)fVar43 >= iVar11) * (int)fVar43
        ;
        uVar49 = (uint)((int)fVar48 < iVar11) * iVar11 | (uint)((int)fVar48 >= iVar11) * (int)fVar48
        ;
        uVar51 = (uint)((int)fVar50 < iVar11) * iVar11 | (uint)((int)fVar50 >= iVar11) * (int)fVar50
        ;
        uVar53 = (uint)((int)fVar52 < iVar11) * iVar11 | (uint)((int)fVar52 >= iVar11) * (int)fVar52
        ;
        pfVar4 = (float *)((long)&pNVar40[4].ptr + local_9a8);
        fVar43 = (*pfVar4 - fVar5) * fVar8;
        fVar48 = (pfVar4[1] - fVar5) * fVar8;
        fVar50 = (pfVar4[2] - fVar5) * fVar8;
        fVar52 = (pfVar4[3] - fVar5) * fVar8;
        pfVar4 = (float *)((long)&pNVar40[4].ptr + local_978);
        fVar54 = (*pfVar4 - fVar6) * fVar9;
        fVar59 = (pfVar4[1] - fVar6) * fVar9;
        fVar62 = (pfVar4[2] - fVar6) * fVar9;
        fVar66 = (pfVar4[3] - fVar6) * fVar9;
        uVar70 = (uint)((int)fVar43 < (int)fVar54) * (int)fVar43 |
                 (uint)((int)fVar43 >= (int)fVar54) * (int)fVar54;
        uVar72 = (uint)((int)fVar48 < (int)fVar59) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar59) * (int)fVar59;
        uVar74 = (uint)((int)fVar50 < (int)fVar62) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar62) * (int)fVar62;
        uVar76 = (uint)((int)fVar52 < (int)fVar66) * (int)fVar52 |
                 (uint)((int)fVar52 >= (int)fVar66) * (int)fVar66;
        pfVar4 = (float *)((long)&pNVar40[4].ptr + uVar38);
        fVar43 = (*pfVar4 - fVar7) * fVar10;
        fVar48 = (pfVar4[1] - fVar7) * fVar10;
        fVar50 = (pfVar4[2] - fVar7) * fVar10;
        fVar52 = (pfVar4[3] - fVar7) * fVar10;
        uVar56 = (uint)(iVar12 < (int)fVar43) * iVar12 | (uint)(iVar12 >= (int)fVar43) * (int)fVar43
        ;
        uVar61 = (uint)(iVar12 < (int)fVar48) * iVar12 | (uint)(iVar12 >= (int)fVar48) * (int)fVar48
        ;
        uVar64 = (uint)(iVar12 < (int)fVar50) * iVar12 | (uint)(iVar12 >= (int)fVar50) * (int)fVar50
        ;
        uVar68 = (uint)(iVar12 < (int)fVar52) * iVar12 | (uint)(iVar12 >= (int)fVar52) * (int)fVar52
        ;
        auVar46._0_4_ =
             -(uint)((int)(((int)uVar70 < (int)uVar56) * uVar70 |
                          ((int)uVar70 >= (int)uVar56) * uVar56) <
                    (int)(((int)uVar44 < (int)uVar55) * uVar55 |
                         ((int)uVar44 >= (int)uVar55) * uVar44));
        auVar46._4_4_ =
             -(uint)((int)(((int)uVar72 < (int)uVar61) * uVar72 |
                          ((int)uVar72 >= (int)uVar61) * uVar61) <
                    (int)(((int)uVar49 < (int)uVar60) * uVar60 |
                         ((int)uVar49 >= (int)uVar60) * uVar49));
        auVar46._8_4_ =
             -(uint)((int)(((int)uVar74 < (int)uVar64) * uVar74 |
                          ((int)uVar74 >= (int)uVar64) * uVar64) <
                    (int)(((int)uVar51 < (int)uVar63) * uVar63 |
                         ((int)uVar51 >= (int)uVar63) * uVar51));
        auVar46._12_4_ =
             -(uint)((int)(((int)uVar76 < (int)uVar68) * uVar76 |
                          ((int)uVar76 >= (int)uVar68) * uVar68) <
                    (int)(((int)uVar53 < (int)uVar67) * uVar67 |
                         ((int)uVar53 >= (int)uVar67) * uVar53));
        uVar44 = movmskps((int)pNVar32,auVar46);
        pNVar32 = (NodeRef *)((ulong)uVar44 ^ 0xf);
        unaff_RBP = (ulong)pNVar32 & 0xff;
      }
      if (((ulong)pNVar40 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar84 = 4;
        }
        else {
          uVar39 = (ulong)pNVar40 & 0xfffffffffffffff0;
          lVar41 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
            }
          }
          pNVar32 = *(NodeRef **)(uVar39 + lVar41 * 8);
          uVar37 = unaff_RBP - 1 & unaff_RBP;
          pNVar40 = pNVar32;
          if (uVar37 != 0) {
            local_988->ptr = (size_t)pNVar32;
            lVar41 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
              }
            }
            uVar33 = uVar37 - 1;
            while( true ) {
              local_988 = local_988 + 1;
              pNVar40 = *(NodeRef **)(uVar39 + lVar41 * 8);
              uVar33 = uVar33 & uVar37;
              if (uVar33 == 0) break;
              local_988->ptr = (size_t)pNVar40;
              lVar41 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              uVar37 = uVar33 - 1;
            }
            pNVar32 = (NodeRef *)0x0;
          }
          uVar84 = 0;
        }
      }
    } while (uVar84 == 0);
    if (uVar84 == 6) {
      uVar84 = 0;
      local_960 = (ulong)((uint)pNVar40 & 0xf) - 8;
      uVar34 = CONCAT71((int7)(local_960 >> 8),local_960 != 0);
      if (local_960 != 0) {
        uVar37 = (ulong)pNVar40 & 0xfffffffffffffff0;
        uVar39 = 0;
        do {
          lVar41 = uVar39 * 0xb0;
          pfVar4 = (float *)(uVar37 + 0x80 + lVar41);
          fVar62 = *pfVar4;
          fVar66 = pfVar4[1];
          fVar88 = pfVar4[2];
          fVar89 = pfVar4[3];
          pfVar4 = (float *)(uVar37 + 0x40 + lVar41);
          fVar90 = *pfVar4;
          fVar101 = pfVar4[1];
          fVar103 = pfVar4[2];
          fVar105 = pfVar4[3];
          pfVar4 = (float *)(uVar37 + 0x70 + lVar41);
          fVar99 = *pfVar4;
          fVar85 = pfVar4[1];
          fVar86 = pfVar4[2];
          fVar87 = pfVar4[3];
          pfVar4 = (float *)(uVar37 + 0x50 + lVar41);
          fVar65 = *pfVar4;
          fVar69 = pfVar4[1];
          fVar21 = pfVar4[2];
          fVar22 = pfVar4[3];
          fVar71 = fVar99 * fVar65 - fVar62 * fVar90;
          fVar73 = fVar85 * fVar69 - fVar66 * fVar101;
          fVar75 = fVar86 * fVar21 - fVar88 * fVar103;
          fVar77 = fVar87 * fVar22 - fVar89 * fVar105;
          pfVar4 = (float *)(uVar37 + 0x60 + lVar41);
          fVar23 = *pfVar4;
          fVar24 = pfVar4[1];
          fVar25 = pfVar4[2];
          fVar26 = pfVar4[3];
          pfVar3 = (float *)(uVar37 + lVar41);
          pfVar4 = (float *)(uVar37 + 0x10 + lVar41);
          pfVar1 = (float *)(uVar37 + 0x20 + lVar41);
          pfVar2 = (float *)(uVar37 + 0x30 + lVar41);
          fVar27 = *pfVar2;
          fVar28 = pfVar2[1];
          fVar29 = pfVar2[2];
          fVar30 = pfVar2[3];
          local_888[0] = fVar62 * fVar27 - fVar65 * fVar23;
          local_888[1] = fVar66 * fVar28 - fVar69 * fVar24;
          local_888[2] = fVar88 * fVar29 - fVar21 * fVar25;
          local_888[3] = fVar89 * fVar30 - fVar22 * fVar26;
          fVar43 = *(float *)(ray + k * 4);
          fVar48 = *(float *)(ray + k * 4 + 0x20);
          fVar50 = *(float *)(ray + k * 4 + 0x40);
          fVar78 = *pfVar3 - fVar43;
          fVar79 = pfVar3[1] - fVar43;
          fVar80 = pfVar3[2] - fVar43;
          fVar43 = pfVar3[3] - fVar43;
          fVar91 = *pfVar1 - fVar48;
          fVar92 = pfVar1[1] - fVar48;
          fVar93 = pfVar1[2] - fVar48;
          fVar48 = pfVar1[3] - fVar48;
          fVar52 = *(float *)(ray + k * 4 + 0x60);
          fVar106 = fVar50 * fVar91 - fVar78 * fVar52;
          fVar107 = fVar50 * fVar92 - fVar79 * fVar52;
          fVar108 = fVar50 * fVar93 - fVar80 * fVar52;
          fVar109 = fVar50 * fVar48 - fVar43 * fVar52;
          local_878[0] = fVar90 * fVar23 - fVar99 * fVar27;
          local_878[1] = fVar101 * fVar24 - fVar85 * fVar28;
          local_878[2] = fVar103 * fVar25 - fVar86 * fVar29;
          local_878[3] = fVar105 * fVar26 - fVar87 * fVar30;
          fVar54 = *(float *)(ray + k * 4 + 0x10);
          fVar81 = *pfVar4 - fVar54;
          fVar82 = pfVar4[1] - fVar54;
          fVar83 = pfVar4[2] - fVar54;
          fVar54 = pfVar4[3] - fVar54;
          fVar59 = *(float *)(ray + k * 4 + 0x50);
          fVar98 = fVar52 * fVar81 - fVar59 * fVar91;
          fVar100 = fVar52 * fVar82 - fVar59 * fVar92;
          fVar102 = fVar52 * fVar83 - fVar59 * fVar93;
          fVar104 = fVar52 * fVar54 - fVar59 * fVar48;
          fVar110 = fVar59 * fVar78 - fVar50 * fVar81;
          fVar111 = fVar59 * fVar79 - fVar50 * fVar82;
          fVar112 = fVar59 * fVar80 - fVar50 * fVar83;
          fVar113 = fVar59 * fVar43 - fVar50 * fVar54;
          fVar94 = fVar52 * local_878[0] + local_888[0] * fVar59 + fVar71 * fVar50;
          fVar95 = fVar52 * local_878[1] + local_888[1] * fVar59 + fVar73 * fVar50;
          fVar96 = fVar52 * local_878[2] + local_888[2] * fVar59 + fVar75 * fVar50;
          fVar97 = fVar52 * local_878[3] + local_888[3] * fVar59 + fVar77 * fVar50;
          uVar84 = (uint)fVar94 & 0x80000000;
          uVar44 = (uint)fVar95 & 0x80000000;
          uVar49 = (uint)fVar96 & 0x80000000;
          uVar51 = (uint)fVar97 & 0x80000000;
          fVar50 = (float)((uint)(fVar23 * fVar98 + fVar99 * fVar106 + fVar62 * fVar110) ^ uVar84);
          fVar52 = (float)((uint)(fVar24 * fVar100 + fVar85 * fVar107 + fVar66 * fVar111) ^ uVar44);
          fVar59 = (float)((uint)(fVar25 * fVar102 + fVar86 * fVar108 + fVar88 * fVar112) ^ uVar49);
          fVar62 = (float)((uint)(fVar26 * fVar104 + fVar87 * fVar109 + fVar89 * fVar113) ^ uVar51);
          fVar99 = (float)((uint)(fVar98 * fVar27 + fVar106 * fVar90 + fVar110 * fVar65) ^ uVar84);
          fVar101 = (float)((uint)(fVar100 * fVar28 + fVar107 * fVar101 + fVar111 * fVar69) ^ uVar44
                           );
          fVar103 = (float)((uint)(fVar102 * fVar29 + fVar108 * fVar103 + fVar112 * fVar21) ^ uVar49
                           );
          fVar105 = (float)((uint)(fVar104 * fVar30 + fVar109 * fVar105 + fVar113 * fVar22) ^ uVar51
                           );
          fVar66 = ABS(fVar94);
          fVar88 = ABS(fVar95);
          fVar89 = ABS(fVar96);
          fVar90 = ABS(fVar97);
          bVar19 = fVar50 + fVar99 <= fVar66 && ((0.0 <= fVar99 && 0.0 <= fVar50) && fVar94 != 0.0);
          bVar20 = fVar52 + fVar101 <= fVar88 &&
                   ((0.0 <= fVar101 && 0.0 <= fVar52) && fVar95 != 0.0);
          bVar18 = fVar59 + fVar103 <= fVar89 &&
                   ((0.0 <= fVar103 && 0.0 <= fVar59) && fVar96 != 0.0);
          bVar42 = fVar62 + fVar105 <= fVar90 &&
                   ((0.0 <= fVar105 && 0.0 <= fVar62) && fVar97 != 0.0);
          uVar36 = (undefined4)((ulong)uVar34 >> 0x20);
          auVar17._4_4_ = -(uint)bVar20;
          auVar17._0_4_ = -(uint)bVar19;
          auVar17._8_4_ = -(uint)bVar18;
          auVar17._12_4_ = -(uint)bVar42;
          iVar31 = movmskps((int)uVar34,auVar17);
          local_a98 = CONCAT44(uVar36,iVar31);
          if (iVar31 != 0) {
            fVar85 = (float)(uVar84 ^ (uint)(fVar78 * fVar71 +
                                            fVar81 * local_888[0] + fVar91 * local_878[0]));
            fVar86 = (float)(uVar44 ^ (uint)(fVar79 * fVar73 +
                                            fVar82 * local_888[1] + fVar92 * local_878[1]));
            fVar87 = (float)(uVar49 ^ (uint)(fVar80 * fVar75 +
                                            fVar83 * local_888[2] + fVar93 * local_878[2]));
            fVar54 = (float)(uVar51 ^ (uint)(fVar43 * fVar77 +
                                            fVar54 * local_888[3] + fVar48 * local_878[3]));
            fVar43 = *(float *)(ray + k * 4 + 0x30);
            fVar48 = *(float *)(ray + k * 4 + 0x80);
            auVar45._0_4_ =
                 -(uint)((fVar85 <= fVar48 * fVar66 && fVar43 * fVar66 < fVar85) && bVar19);
            auVar45._4_4_ =
                 -(uint)((fVar86 <= fVar48 * fVar88 && fVar43 * fVar88 < fVar86) && bVar20);
            auVar45._8_4_ =
                 -(uint)((fVar87 <= fVar48 * fVar89 && fVar43 * fVar89 < fVar87) && bVar18);
            auVar45._12_4_ =
                 -(uint)((fVar54 <= fVar48 * fVar90 && fVar43 * fVar90 < fVar54) && bVar42);
            iVar31 = movmskps(iVar31,auVar45);
            local_a98 = CONCAT44(uVar36,iVar31);
            if (iVar31 != 0) {
              local_898._4_4_ = fVar73;
              local_898._0_4_ = fVar71;
              local_898._8_4_ = fVar75;
              local_898._12_4_ = fVar77;
              pSVar13 = context->scene;
              auVar16._4_4_ = fVar88;
              auVar16._0_4_ = fVar66;
              auVar16._8_4_ = fVar89;
              auVar16._12_4_ = fVar90;
              auVar46 = rcpps(local_898,auVar16);
              fVar43 = auVar46._0_4_;
              fVar48 = auVar46._4_4_;
              fVar65 = auVar46._8_4_;
              fVar69 = auVar46._12_4_;
              fVar43 = (1.0 - fVar66 * fVar43) * fVar43 + fVar43;
              fVar48 = (1.0 - fVar88 * fVar48) * fVar48 + fVar48;
              fVar65 = (1.0 - fVar89 * fVar65) * fVar65 + fVar65;
              fVar69 = (1.0 - fVar90 * fVar69) * fVar69 + fVar69;
              local_8a8[0] = fVar85 * fVar43;
              local_8a8[1] = fVar86 * fVar48;
              local_8a8[2] = fVar87 * fVar65;
              local_8a8[3] = fVar54 * fVar69;
              local_8c8._0_4_ = fVar50 * fVar43;
              local_8c8._4_4_ = fVar52 * fVar48;
              local_8c8._8_4_ = fVar59 * fVar65;
              local_8c8._12_4_ = fVar62 * fVar69;
              local_8b8._0_4_ = fVar43 * fVar99;
              local_8b8._4_4_ = fVar48 * fVar101;
              local_8b8._8_4_ = fVar65 * fVar103;
              local_8b8._12_4_ = fVar69 * fVar105;
              do {
                uVar33 = 0;
                if (local_a98 != 0) {
                  for (; (local_a98 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                local_808 = *(uint *)(lVar41 + uVar37 + 0x90 + uVar33 * 4);
                local_980 = (ulong)local_808;
                pGVar14 = (pSVar13->geometries).items[local_980].ptr;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_a98 = local_a98 ^ 1L << (uVar33 & 0x3f);
                  bVar42 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar42 = false;
                }
                else {
                  uVar36 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_838 = *(undefined4 *)(local_8c8 + uVar33 * 4);
                  fVar43 = local_8a8[uVar33 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar33];
                  args.context = context->user;
                  local_818 = *(undefined4 *)(lVar41 + uVar37 + 0xa0 + uVar33 * 4);
                  local_828._4_4_ = fVar43;
                  local_828._0_4_ = fVar43;
                  local_828._8_4_ = fVar43;
                  local_828._12_4_ = fVar43;
                  local_868 = local_888[uVar33 - 4];
                  local_858 = local_888[uVar33];
                  local_848 = local_878[uVar33];
                  fStack_864 = local_868;
                  fStack_860 = local_868;
                  fStack_85c = local_868;
                  fStack_854 = local_858;
                  fStack_850 = local_858;
                  fStack_84c = local_858;
                  fStack_844 = local_848;
                  fStack_840 = local_848;
                  fStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_814 = local_818;
                  uStack_810 = local_818;
                  uStack_80c = local_818;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_9b8 = *local_970;
                  args.valid = (int *)local_9b8;
                  args.geometryUserPtr = pGVar14->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  pRVar35 = (RTCRayN *)pGVar14->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar35 != (RTCRayN *)0x0) {
                    pRVar35 = (RTCRayN *)(*(code *)pRVar35)(&args);
                  }
                  if (local_9b8 == (undefined1  [16])0x0) {
                    auVar57._8_4_ = 0xffffffff;
                    auVar57._0_8_ = 0xffffffffffffffff;
                    auVar57._12_4_ = 0xffffffff;
                    auVar57 = auVar57 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&args);
                    }
                    auVar47._0_4_ = -(uint)(local_9b8._0_4_ == 0);
                    auVar47._4_4_ = -(uint)(local_9b8._4_4_ == 0);
                    auVar47._8_4_ = -(uint)(local_9b8._8_4_ == 0);
                    auVar47._12_4_ = -(uint)(local_9b8._12_4_ == 0);
                    auVar57 = auVar47 ^ _DAT_01febe20;
                    auVar46 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar47
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar46;
                    pRVar35 = args.ray;
                  }
                  auVar58._0_4_ = auVar57._0_4_ << 0x1f;
                  auVar58._4_4_ = auVar57._4_4_ << 0x1f;
                  auVar58._8_4_ = auVar57._8_4_ << 0x1f;
                  auVar58._12_4_ = auVar57._12_4_ << 0x1f;
                  iVar31 = movmskps((int)pRVar35,auVar58);
                  bVar42 = iVar31 == 0;
                  if (bVar42) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar36;
                    local_a98 = local_a98 ^ 1L << (uVar33 & 0x3f);
                  }
                }
                uVar84 = 0;
                if (!bVar42) {
                  if ((char)uVar34 != '\0') {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar84 = 1;
                  }
                  goto LAB_002640ff;
                }
              } while (local_a98 != 0);
              local_a98 = 0;
            }
          }
          uVar84 = 0;
          uVar39 = uVar39 + 1;
          uVar34 = CONCAT71((int7)(local_a98 >> 8),uVar39 < local_960);
        } while (uVar39 != local_960);
      }
    }
LAB_002640ff:
    pNVar40 = local_988;
  } while ((uVar84 & 3) == 0);
  return local_968 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }